

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::setCursorVisible(QWidgetTextControlPrivate *this,bool visible)

{
  long lVar1;
  Object OVar2;
  byte in_SIL;
  Object *in_RDI;
  long in_FS_OFFSET;
  Function in_stack_00000010;
  offset_in_QStyleHints_to_subr in_stack_00000020;
  Object *in_stack_ffffffffffffff90;
  QWidgetTextControlPrivate *in_stack_ffffffffffffffa0;
  Function in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = (Object)(in_SIL & 1);
  if ((Object)((byte)in_RDI[0x81] & 1) != OVar2) {
    in_RDI[0x81] = OVar2;
    updateCursorBlinking(in_stack_ffffffffffffffa0);
    if (((byte)in_RDI[0x81] & 1) == 0) {
      QGuiApplication::styleHints();
      QObjectPrivate::disconnect<void(QStyleHints::*)(int),void(QWidgetTextControlPrivate::*)()>
                (in_RDI,CONCAT17(OVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffffc0);
    }
    else {
      QGuiApplication::styleHints();
      QObjectPrivate::connect<void(QStyleHints::*)(int),void(QWidgetTextControlPrivate::*)()>
                ((Object *)in_stack_fffffffffffffff0.d_ptr,in_stack_00000020,(Object *)0x0,
                 in_stack_00000010,AutoConnection);
      QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::setCursorVisible(bool visible)
{
    if (cursorVisible == visible)
        return;

    cursorVisible = visible;
    updateCursorBlinking();

    if (cursorVisible)
        connect(QGuiApplication::styleHints(), &QStyleHints::cursorFlashTimeChanged, this, &QWidgetTextControlPrivate::updateCursorBlinking);
    else
        disconnect(QGuiApplication::styleHints(), &QStyleHints::cursorFlashTimeChanged, this, &QWidgetTextControlPrivate::updateCursorBlinking);
}